

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk98(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk98 *peVar4;
  envy_bios_power_unk98_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk98 *unk98;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk98;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk98.version);
    if ((bios->power).unk98.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk98.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk98.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk98.entriesnum);
      (bios->power).unk98.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk98_entry *)malloc((ulong)(bios->power).unk98.entriesnum << 2);
      (bios->power).unk98.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk98.entriesnum; data = data + 1) {
        (bios->power).unk98.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk98.hlen + data * (bios->power).unk98.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown OVERCLOCKING table version 0x%x\n",(ulong)(bios->power).unk98.version
             );
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk98(struct envy_bios *bios) {
	struct envy_bios_power_unk98 *unk98 = &bios->power.unk98;
	int i, err = 0;

	if (!unk98->offset)
		return -EINVAL;

	bios_u8(bios, unk98->offset + 0x0, &unk98->version);
	switch(unk98->version) {
	case 0x10:
		err |= bios_u8(bios, unk98->offset + 0x1, &unk98->hlen);
		err |= bios_u8(bios, unk98->offset + 0x2, &unk98->rlen);
		err |= bios_u8(bios, unk98->offset + 0x3, &unk98->entriesnum);
		unk98->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown OVERCLOCKING table version 0x%x\n", unk98->version);
		return -EINVAL;
	};

	err = 0;
	unk98->entries = malloc(unk98->entriesnum * sizeof(struct envy_bios_power_unk98_entry));
	for (i = 0; i < unk98->entriesnum; i++) {
		uint32_t data = unk98->offset + unk98->hlen + i * unk98->rlen;

		unk98->entries[i].offset = data;
	}

	return 0;
}